

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O2

void __thiscall S2Polygon::InitLoops(S2Polygon *this,LoopMap *loop_map)

{
  int iVar1;
  _Elt_pointer ppSVar2;
  mapped_type *pmVar3;
  ulong uVar4;
  initializer_list<S2Loop_*> __l;
  S2Loop *loop;
  S2Polygon *local_f0;
  ulong local_e8;
  S2Loop *child;
  LoopMap *local_d8;
  stack<S2Loop_*,_std::deque<S2Loop_*,_std::allocator<S2Loop_*>_>_> loop_stack;
  _Deque_base<S2Loop_*,_std::allocator<S2Loop_*>_> local_80;
  
  loop = (S2Loop *)0x0;
  __l._M_len = 1;
  __l._M_array = &loop;
  local_f0 = this;
  local_d8 = loop_map;
  std::deque<S2Loop_*,_std::allocator<S2Loop_*>_>::deque
            ((deque<S2Loop_*,_std::allocator<S2Loop_*>_> *)&local_80,__l,(allocator_type *)&child);
  std::_Deque_base<S2Loop_*,_std::allocator<S2Loop_*>_>::_Deque_base
            ((_Deque_base<S2Loop_*,_std::allocator<S2Loop_*>_> *)&loop_stack,&local_80);
  std::_Deque_base<S2Loop_*,_std::allocator<S2Loop_*>_>::~_Deque_base(&local_80);
  local_f0 = (S2Polygon *)&local_f0->loops_;
  local_e8 = 0xffffffffffffffff;
  do {
    if (loop_stack.c.super__Deque_base<S2Loop_*,_std::allocator<S2Loop_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        loop_stack.c.super__Deque_base<S2Loop_*,_std::allocator<S2Loop_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
      std::_Deque_base<S2Loop_*,_std::allocator<S2Loop_*>_>::~_Deque_base
                ((_Deque_base<S2Loop_*,_std::allocator<S2Loop_*>_> *)&loop_stack);
      return;
    }
    ppSVar2 = loop_stack.c.super__Deque_base<S2Loop_*,_std::allocator<S2Loop_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    if (loop_stack.c.super__Deque_base<S2Loop_*,_std::allocator<S2Loop_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        loop_stack.c.super__Deque_base<S2Loop_*,_std::allocator<S2Loop_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppSVar2 = loop_stack.c.super__Deque_base<S2Loop_*,_std::allocator<S2Loop_*>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    loop = ppSVar2[-1];
    std::deque<S2Loop_*,_std::allocator<S2Loop_*>_>::pop_back(&loop_stack.c);
    if (loop != (S2Loop *)0x0) {
      local_e8 = (ulong)(uint)loop->depth_;
      std::
      vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
      ::emplace_back<S2Loop*&>
                ((vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
                  *)local_f0,&loop);
    }
    pmVar3 = std::
             map<S2Loop_*,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>_>_>_>
             ::operator[](local_d8,&loop);
    iVar1 = (int)local_e8;
    uVar4 = (ulong)((long)(pmVar3->super__Vector_base<S2Loop_*,_std::allocator<S2Loop_*>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(pmVar3->super__Vector_base<S2Loop_*,_std::allocator<S2Loop_*>_>)._M_impl.
                         super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
    while( true ) {
      uVar4 = uVar4 - 1;
      if ((int)(uint)uVar4 < 0) break;
      child = (pmVar3->super__Vector_base<S2Loop_*,_std::allocator<S2Loop_*>_>)._M_impl.
              super__Vector_impl_data._M_start[(uint)uVar4 & 0x7fffffff];
      if (child == (S2Loop *)0x0) {
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)&local_80,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
                   ,0x128,kFatal,(ostream *)&std::cerr);
        std::operator<<((ostream *)local_80._M_impl.super__Deque_impl_data._M_map_size,
                        "Check failed: child != nullptr ");
        abort();
      }
      child->depth_ = iVar1 + 1;
      std::deque<S2Loop_*,_std::allocator<S2Loop_*>_>::push_back(&loop_stack.c,&child);
    }
  } while( true );
}

Assistant:

void S2Polygon::InitLoops(LoopMap* loop_map) {
  std::stack<S2Loop*> loop_stack({nullptr});
  int depth = -1;
  while (!loop_stack.empty()) {
    S2Loop* loop = loop_stack.top();
    loop_stack.pop();
    if (loop != nullptr) {
      depth = loop->depth();
      loops_.emplace_back(loop);
    }
    const vector<S2Loop*>& children = (*loop_map)[loop];
    for (int i = children.size() - 1; i >= 0; --i) {
      S2Loop* child = children[i];
      S2_DCHECK(child != nullptr);
      child->set_depth(depth + 1);
      loop_stack.push(child);
    }
  }
}